

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SecretKey.cpp
# Opt level: O0

optional<jbcoin::SecretKey> *
jbcoin::parseBase58<jbcoin::SecretKey>
          (optional<jbcoin::SecretKey> *__return_storage_ptr__,TokenType type,string *s)

{
  ulong uVar1;
  long lVar2;
  Slice local_80;
  SecretKey local_69;
  undefined4 local_48;
  undefined1 local_40 [8];
  string result;
  string *s_local;
  TokenType type_local;
  
  result.field_2._8_8_ = s;
  decodeBase58Token((string *)local_40,s,type);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    lVar2 = std::__cxx11::string::size();
    if (lVar2 == 0x20) {
      local_80 = makeSlice<std::char_traits<char>,std::allocator<char>>
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_40);
      SecretKey::SecretKey(&local_69,&local_80);
      boost::optional<jbcoin::SecretKey>::optional(__return_storage_ptr__,&local_69);
      SecretKey::~SecretKey(&local_69);
    }
    else {
      boost::optional<jbcoin::SecretKey>::optional(__return_storage_ptr__);
    }
  }
  else {
    boost::optional<jbcoin::SecretKey>::optional(__return_storage_ptr__);
  }
  local_48 = 1;
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

boost::optional<SecretKey>
parseBase58 (TokenType type, std::string const& s)
{
    auto const result = decodeBase58Token(s, type);
    if (result.empty())
        return boost::none;
    if (result.size() != 32)
        return boost::none;
    return SecretKey(makeSlice(result));
}